

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_useragent(Curl_easy *data)

{
  char *pcVar1;
  
  pcVar1 = Curl_checkheaders(data,"User-Agent",10);
  if (pcVar1 != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_useragent(struct Curl_easy *data)
{
  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(data, STRCONST("User-Agent"))) {
    free(data->state.aptr.uagent);
    data->state.aptr.uagent = NULL;
  }
  return CURLE_OK;
}